

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_01;
  void **ppvVar1;
  uint uVar2;
  PointerT<char> pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  long lVar8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  anon_union_216_1_493b367e_for_DescriptorProto_4 *paVar9;
  DescriptorBuilder *this_02;
  DescriptorProto *pDVar10;
  undefined8 uVar11;
  undefined1 *puVar12;
  bool bVar13;
  undefined8 *puVar14;
  string *psVar15;
  pointer prVar16;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar18;
  EnumDescriptor *pEVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar20;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar21;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar22;
  Descriptor *pDVar23;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar24;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  DescriptorPool *pDVar26;
  Rep *pRVar27;
  Symbol SVar28;
  string *psVar29;
  undefined8 extraout_RAX;
  int iVar30;
  uint uVar31;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar32;
  int iVar33;
  FlatAllocator *pFVar34;
  DescriptorProto *pDVar35;
  ulong uVar36;
  long lVar37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  long lVar38;
  long lVar39;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  ulong uVar40;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  iterator iVar41;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  FieldDescriptor *field;
  ExtensionRange *range;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  iterator it;
  Symbol local_138;
  DescriptorBuilder *local_130;
  DescriptorProto *local_128;
  undefined1 local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 *local_f8;
  char local_f0;
  undefined1 local_e8 [80];
  code *pcStack_98;
  undefined8 local_90;
  code *pcStack_88;
  VoidPtr local_80;
  code *pcStack_78;
  VoidPtr local_70;
  code *pcStack_68;
  VoidPtr local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  iterator local_40;
  
  if (parent == (Descriptor *)0x0) {
    psVar15 = this->file_->package_;
  }
  else {
    psVar15 = parent->all_names_ + 1;
  }
  puVar14 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = (psVar15->_M_dataplus)._M_p;
  scope._M_len = psVar15->_M_string_length;
  proto_name._M_str = (char *)*puVar14;
  proto_name._M_len = puVar14[1];
  local_138.ptr_ = &result->super_SymbolBase;
  local_128 = proto;
  psVar15 = AllocateNameStrings_abi_cxx11_(this,scope,proto_name,alloc);
  result->all_names_ = psVar15;
  puVar14 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pFVar34 = (FlatAllocator *)psVar15[1]._M_dataplus._M_p;
  name._M_str = (char *)*puVar14;
  name._M_len = puVar14[1];
  full_name_00._M_str = (char *)pFVar34;
  full_name_00._M_len = psVar15[1]._M_string_length;
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  result->field_0x1 = result->field_0x1 & 0x80;
  result->options_ = (MessageOptions *)0x0;
  local_40 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                         *)&((this->pool_->tables_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl)->well_known_types_,result->all_names_ + 1);
  local_e8._0_8_ = (DescriptorPool *)0x0;
  bVar13 = absl::lts_20240722::container_internal::operator==(&local_40,(iterator *)local_e8);
  if (!bVar13) {
    prVar16 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->(&local_40);
    local_138.ptr_[1].symbol_type_ =
         local_138.ptr_[1].symbol_type_ & 0x83 |
         ((char)prVar16->second & (WELLKNOWNTYPE_STRUCT|WELLKNOWNTYPE_LISTVALUE)) << 2;
  }
  *(uint16_t *)(local_138.ptr_ + 2) = 0;
  this_00 = &(local_128->field_0)._impl_.field_;
  if (0 < *(int *)((long)&local_128->field_0 + 0x10)) {
    uVar31 = 0;
    do {
      pVVar17 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,uVar31);
      uVar2 = (pVVar17->field_0)._impl_.number_;
      if ((uVar2 != uVar31 + 1) ||
         (*(uint16_t *)(local_138.ptr_ + 2) = (uint16_t)uVar2, 0xfffd < uVar31)) break;
      uVar31 = uVar2;
    } while ((int)uVar2 < *(int *)((long)&local_128->field_0 + 0x10));
  }
  pDVar35 = local_128;
  iVar33 = *(int *)((long)&local_128->field_0 + 0x88);
  *(int *)(local_138.ptr_ + 0x78) = iVar33;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_e8);
LAB_001f251f:
    BuildMessage();
  }
  else {
    iVar30 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    iVar33 = iVar33 * 0x38 + iVar30;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar33;
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).total_.payload_.super_Base<char>.value < iVar33) goto LAB_001f251f;
    *(OneofDescriptor **)(local_138.ptr_ + 0x40) = (OneofDescriptor *)(pcVar3 + iVar30);
    local_120._8_8_ = parent;
    local_e8._32_8_ = this_00;
    if (0 < *(int *)((long)&local_128->field_0 + 0x88)) {
      paVar9 = &local_128->field_0;
      lVar38 = 0;
      lVar39 = 0;
      do {
        proto_00 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                             (&(paVar9->_impl_).oneof_decl_.super_RepeatedPtrFieldBase,(int)lVar39);
        pFVar34 = alloc;
        BuildOneof(this,proto_00,(Descriptor *)local_138.ptr_,
                   (OneofDescriptor *)
                   (&(*(OneofDescriptor **)(local_138.ptr_ + 0x40))->super_SymbolBase + lVar38),
                   alloc);
        lVar39 = lVar39 + 1;
        lVar38 = lVar38 + 0x38;
      } while (lVar39 < *(int *)((long)&pDVar35->field_0 + 0x88));
    }
    iVar33 = *(int *)((long)&pDVar35->field_0 + 0x10);
    *(int *)(local_138.ptr_ + 4) = iVar33;
    pFVar18 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::FieldDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar33);
    uVar11 = local_e8._32_8_;
    pDVar10 = local_128;
    *(FieldDescriptor **)(local_138.ptr_ + 0x38) = pFVar18;
    if (0 < *(int *)((long)&pDVar35->field_0 + 0x10)) {
      lVar39 = 0;
      lVar38 = 0;
      do {
        pVVar17 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            ((RepeatedPtrFieldBase *)uVar11,(int)lVar38);
        pFVar34 = (FlatAllocator *)0x0;
        BuildFieldOrExtension
                  (this,pVVar17,(Descriptor *)local_138.ptr_,
                   (FieldDescriptor *)
                   (&(*(FieldDescriptor **)(local_138.ptr_ + 0x38))->super_SymbolBase + lVar39),
                   false,alloc);
        lVar38 = lVar38 + 1;
        lVar39 = lVar39 + 0x58;
      } while (lVar38 < *(int *)((long)&pDVar10->field_0 + 0x10));
    }
    pDVar35 = local_128;
    iVar33 = *(int *)((long)&local_128->field_0 + 0x40);
    *(int *)(local_138.ptr_ + 0x84) = iVar33;
    pEVar19 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::EnumDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar33);
    *(EnumDescriptor **)(local_138.ptr_ + 0x50) = pEVar19;
    if (0 < *(int *)((long)&pDVar35->field_0 + 0x40)) {
      lVar38 = 0;
      lVar39 = 0;
      do {
        proto_01 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                             (&(pDVar35->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                              (int)lVar39);
        pFVar34 = alloc;
        BuildEnum(this,proto_01,(Descriptor *)local_138.ptr_,
                  (EnumDescriptor *)
                  (&(*(EnumDescriptor **)(local_138.ptr_ + 0x50))->super_SymbolBase + lVar38),alloc)
        ;
        lVar39 = lVar39 + 1;
        lVar38 = lVar38 + 0x58;
      } while (lVar39 < *(int *)((long)&pDVar35->field_0 + 0x40));
    }
    iVar33 = *(int *)((long)&pDVar35->field_0 + 0x58);
    *(int *)(local_138.ptr_ + 0x88) = iVar33;
    pEVar20 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar33);
    *(ExtensionRange **)(local_138.ptr_ + 0x58) = pEVar20;
    if (0 < *(int *)((long)&pDVar35->field_0 + 0x58)) {
      lVar38 = 0;
      lVar39 = 0;
      do {
        pVVar21 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                            (&(pDVar35->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                             (int)lVar39);
        pFVar34 = alloc;
        BuildExtensionRange(this,pVVar21,(Descriptor *)local_138.ptr_,
                            (ExtensionRange *)
                            ((long)&(*(ExtensionRange **)(local_138.ptr_ + 0x58))->start_ + lVar38),
                            alloc);
        lVar39 = lVar39 + 1;
        lVar38 = lVar38 + 0x28;
      } while (lVar39 < *(int *)((long)&pDVar35->field_0 + 0x58));
    }
    iVar33 = *(int *)((long)&pDVar35->field_0 + 0x70);
    *(int *)(local_138.ptr_ + 0x8c) = iVar33;
    pFVar18 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::FieldDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar33);
    *(FieldDescriptor **)(local_138.ptr_ + 0x60) = pFVar18;
    if (0 < *(int *)((long)&pDVar35->field_0 + 0x70)) {
      lVar38 = 0;
      lVar39 = 0;
      do {
        pVVar17 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (&(pDVar35->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                             (int)lVar39);
        pFVar34 = (FlatAllocator *)0x1;
        BuildFieldOrExtension
                  (this,pVVar17,(Descriptor *)local_138.ptr_,
                   (FieldDescriptor *)
                   (&(*(FieldDescriptor **)(local_138.ptr_ + 0x60))->super_SymbolBase + lVar38),true
                   ,alloc);
        lVar39 = lVar39 + 1;
        lVar38 = lVar38 + 0x58;
      } while (lVar39 < *(int *)((long)&pDVar35->field_0 + 0x70));
    }
    pDVar10 = local_128;
    iVar33 = *(int *)((long)&pDVar35->field_0 + 0xa0);
    *(int *)(local_138.ptr_ + 0x90) = iVar33;
    pcVar3 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<char>.value;
    if (pcVar3 != (PointerT<char>)0x0) {
      iVar30 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar33 = iVar30 + iVar33 * 8;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar33;
      if (iVar33 <= (alloc->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).total_.payload_.super_Base<char>.value) {
        *(ReservedRange **)(local_138.ptr_ + 0x68) = (ReservedRange *)(pcVar3 + iVar30);
        if (0 < *(int *)((long)&local_128->field_0 + 0xa0)) {
          paVar9 = &local_128->field_0;
          lVar38 = 0;
          lVar39 = 0;
          do {
            pVVar22 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                (&(paVar9->_impl_).reserved_range_.super_RepeatedPtrFieldBase,
                                 (int)lVar39);
            BuildReservedRange(this,pVVar22,(Descriptor *)local_138.ptr_,
                               (ReservedRange *)
                               ((long)&(*(ReservedRange **)(local_138.ptr_ + 0x68))->start + lVar38)
                               ,pFVar34);
            lVar39 = lVar39 + 1;
            lVar38 = lVar38 + 8;
          } while (lVar39 < *(int *)((long)&pDVar10->field_0 + 0xa0));
        }
        option_name._M_str = "google.protobuf.MessageOptions";
        option_name._M_len = 0x1e;
        AllocateOptions<google::protobuf::Descriptor>
                  (this,pDVar10,(Descriptor *)local_138.ptr_,7,option_name,alloc);
        iVar33 = this->recursion_depth_;
        this->recursion_depth_ = iVar33 + -1;
        if (iVar33 < 2) {
          element_name._M_str = (*(string **)(local_138.ptr_ + 8))[1]._M_dataplus._M_p;
          element_name._M_len = (*(string **)(local_138.ptr_ + 8))[1]._M_string_length;
          AddError(this,element_name,&pDVar10->super_Message,OTHER,
                   "Reached maximum recursion limit for nested messages.");
          *(Descriptor **)(local_138.ptr_ + 0x48) = (Descriptor *)0x0;
          *(int *)(local_138.ptr_ + 0x80) = 0;
        }
        else {
          iVar33 = *(int *)((long)&pDVar10->field_0 + 0x28);
          *(int *)(local_138.ptr_ + 0x80) = iVar33;
          pDVar23 = anon_unknown_23::
                    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ::AllocateArray<google::protobuf::Descriptor>
                              (&alloc->
                                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ,iVar33);
          *(Descriptor **)(local_138.ptr_ + 0x48) = pDVar23;
          pDVar35 = pDVar10;
          if (0 < *(int *)((long)&pDVar10->field_0 + 0x28)) {
            lVar38 = 0;
            lVar39 = 0;
            do {
              proto_02 = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                   (&(pDVar10->field_0)._impl_.nested_type_.
                                     super_RepeatedPtrFieldBase,(int)lVar39);
              BuildMessage(this,proto_02,(Descriptor *)local_138.ptr_,
                           (Descriptor *)
                           (&(*(Descriptor **)(local_138.ptr_ + 0x48))->super_SymbolBase + lVar38),
                           alloc);
              lVar39 = lVar39 + 1;
              lVar38 = lVar38 + 0x98;
              pDVar35 = local_128;
            } while (lVar39 < *(int *)((long)&local_128->field_0 + 0x28));
          }
          uVar31 = *(uint *)((long)&pDVar35->field_0 + 0xb8);
          *(uint *)(local_138.ptr_ + 0x94) = uVar31;
          ppbVar24 = (anonymous_namespace)::
                     FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                     ::AllocateArray<std::__cxx11::string_const*>
                               ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                 *)alloc,uVar31);
          uVar11 = local_120._8_8_;
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
           (local_138.ptr_ + 0x70) = ppbVar24;
          local_130 = this;
          if (0 < (int)uVar31) {
            paVar9 = &local_128->field_0;
            uVar36 = 0;
            do {
              in = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (&(paVar9->_impl_).reserved_name_.super_RepeatedPtrFieldBase,
                              (int)uVar36);
              psVar15 = (anonymous_namespace)::
                        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        ::AllocateStrings<std::__cxx11::string_const&>
                                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                    *)alloc,in);
              (*(string ***)(local_138.ptr_ + 0x70))[uVar36] = psVar15;
              uVar36 = uVar36 + 1;
            } while (uVar31 != uVar36);
          }
          pDVar35 = local_128;
          puVar14 = *(undefined8 **)(local_138.ptr_ + 8);
          pcVar4 = (char *)puVar14[4];
          sVar5 = puVar14[5];
          pcVar6 = (char *)*puVar14;
          sVar7 = puVar14[1];
          (local_138.ptr_)->symbol_type_ = '\x01';
          full_name._M_str = pcVar4;
          full_name._M_len = sVar5;
          name_00._M_str = pcVar6;
          name_00._M_len = sVar7;
          AddSymbol(local_130,full_name,(void *)uVar11,name_00,&local_128->super_Message,local_138);
          if (0 < *(int *)((long)&pDVar35->field_0 + 0xa0)) {
            this_01 = &(pDVar35->field_0)._impl_.reserved_range_;
            uVar31 = 0;
            do {
              aVar25.slot_ = (slot_type *)
                             internal::RepeatedPtrFieldBase::
                             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                       (&this_01->super_RepeatedPtrFieldBase,uVar31);
              iVar30 = uVar31 + 1;
              iVar33 = *(int *)((long)&pDVar35->field_0 + 0xa0);
              local_120._16_4_ = iVar30;
              local_120._8_8_ = (Descriptor *)(ulong)uVar31;
              if (iVar30 < iVar33) {
                do {
                  pDVar26 = (DescriptorPool *)
                            internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                      (&this_01->super_RepeatedPtrFieldBase,iVar30);
                  if ((*(int *)&pDVar26->underlay_ < *(int *)((long)aVar25.slot_ + 0x1c)) &&
                     (*(int *)((long)aVar25.slot_ + 0x18) < *(int *)((long)&pDVar26->underlay_ + 4))
                     ) {
                    pcVar4 = *(char **)(*(long *)(local_138.ptr_ + 8) + 0x20);
                    sVar5 = *(size_t *)(*(long *)(local_138.ptr_ + 8) + 0x28);
                    pVVar22 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        (&this_01->super_RepeatedPtrFieldBase,(int)local_120._8_8_);
                    pcStack_48 = absl::lts_20240722::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                    ;
                    local_50.obj = local_e8;
                    make_error.invoker_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                    ;
                    make_error.ptr_.obj = local_50.obj;
                    element_name_00._M_str = pcVar4;
                    element_name_00._M_len = sVar5;
                    local_e8._0_8_ = pDVar26;
                    local_e8._8_8_ = aVar25.slot_;
                    AddError(local_130,element_name_00,&pVVar22->super_Message,NUMBER,make_error);
                  }
                  iVar30 = iVar30 + 1;
                  iVar33 = *(int *)((long)&local_128->field_0 + 0xa0);
                } while (iVar30 < iVar33);
              }
              pDVar35 = local_128;
              uVar31 = local_120._16_4_;
            } while ((int)local_120._16_4_ < iVar33);
          }
          local_e8._0_8_ = (DescriptorPool *)0x1;
          local_e8._8_8_ = (slot_type *)0x0;
          this_03 = &(pDVar35->field_0)._impl_.reserved_name_;
          pRVar32 = this_03;
          if ((*(byte *)((long)&pDVar35->field_0 + 0xb0) & 1) != 0) {
            pRVar27 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
            pRVar32 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pRVar27->elements;
            if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar27 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
              this_03 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)pRVar27->elements;
            }
          }
          ppvVar1 = &(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                    *(int *)((long)&pDVar35->field_0 + 0xb8);
          if (pRVar32 !=
              (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)ppvVar1) {
            do {
              key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (pRVar32->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
              local_120._0_8_ = local_e8;
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                          *)&local_100,local_120,key_00,key_00);
              if (local_f0 == '\0') {
                pcStack_58 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
                ;
                make_error_00.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
                ;
                make_error_00.ptr_.obj = &local_100;
                element_name_01._M_str = (key_00->_M_dataplus)._M_p;
                element_name_01._M_len = key_00->_M_string_length;
                local_100 = key_00;
                local_60.obj = &local_100;
                AddError(local_130,element_name_01,&local_128->super_Message,NAME,make_error_00);
              }
              pRVar32 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&(pRVar32->super_RepeatedPtrFieldBase).current_size_;
            } while (pRVar32 !=
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)ppvVar1);
          }
          uVar36 = (ulong)*(uint *)(local_138.ptr_ + 4);
          if (0 < (int)*(uint *)(local_138.ptr_ + 4)) {
            local_120._16_8_ = &local_130->message_hints_;
            local_120._8_8_ = &(local_128->field_0)._impl_.extension_range_;
            local_e8._40_8_ = &(local_128->field_0)._impl_.reserved_range_;
            uVar40 = 0;
            do {
              if ((long)(int)uVar36 <= (long)uVar40) {
                psVar29 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (uVar40 & 0xffffffff,(long)(int)uVar36,"index < field_count()");
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_100,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                           ,0x9f4,*(undefined8 *)(psVar29 + 8),*(undefined8 *)psVar29);
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_100);
              }
              local_120._0_8_ = *(long *)(local_138.ptr_ + 0x38) + uVar40 * 0x58;
              SVar28.ptr_ = local_138.ptr_;
              local_e8._48_8_ = uVar40;
              if (0 < *(int *)(local_138.ptr_ + 0x88)) {
                lVar39 = 0;
                lVar38 = 0;
                do {
                  lVar37 = *(long *)(SVar28.ptr_ + 0x58);
                  local_120._24_8_ = lVar37 + lVar39;
                  if ((*(int *)(lVar37 + lVar39) <= *(int *)(local_120._0_8_ + 4)) &&
                     (*(int *)(local_120._0_8_ + 4) < *(int *)(lVar37 + 4 + lVar39))) {
                    absl::lts_20240722::container_internal::
                    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                    ::try_emplace_impl<google::protobuf::Descriptor*const&>
                              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                                *)&local_100,(void *)local_120._16_8_,(Descriptor **)&local_138);
                    puVar12 = local_f8;
                    pVVar21 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)local_120._8_8_,(int)lVar38);
                    iVar33 = *(int *)(puVar12 + 8);
                    if (iVar33 < 0) {
                      iVar33 = -1;
                    }
                    uVar31 = iVar33 + 1;
                    if (0x1ffffffe < uVar31) {
                      uVar31 = 0x1fffffff;
                    }
                    *(uint *)(puVar12 + 8) = uVar31;
                    if (*(long *)(puVar12 + 0x10) == 0) {
                      *(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
                        **)(puVar12 + 0x10) = pVVar21;
                      *(undefined4 *)(puVar12 + 0x18) = 1;
                    }
                    pcVar4 = *(char **)(*(long *)(local_120._0_8_ + 8) + 0x20);
                    sVar5 = *(size_t *)(*(long *)(local_120._0_8_ + 8) + 0x28);
                    pVVar21 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)local_120._8_8_,(int)lVar38);
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_120 + 0x18);
                    local_f8 = local_120;
                    pcStack_68 = absl::lts_20240722::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                    ;
                    make_error_01.invoker_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                    ;
                    make_error_01.ptr_.obj = &local_100;
                    element_name_02._M_str = pcVar4;
                    element_name_02._M_len = sVar5;
                    local_70.obj = &local_100;
                    AddError(local_130,element_name_02,&pVVar21->super_Message,NUMBER,make_error_01)
                    ;
                    SVar28.ptr_ = local_138.ptr_;
                  }
                  lVar38 = lVar38 + 1;
                  lVar39 = lVar39 + 0x28;
                } while (lVar38 < *(int *)(SVar28.ptr_ + 0x88));
              }
              uVar11 = local_e8._48_8_;
              if (0 < *(int *)(SVar28.ptr_ + 0x90)) {
                lVar38 = 0;
                do {
                  if ((*(int *)(*(long *)(SVar28.ptr_ + 0x68) + lVar38 * 8) <=
                       *(int *)(local_120._0_8_ + 4)) &&
                     (*(int *)(local_120._0_8_ + 4) <
                      *(int *)(*(long *)(SVar28.ptr_ + 0x68) + lVar38 * 8 + 4))) {
                    absl::lts_20240722::container_internal::
                    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                    ::try_emplace_impl<google::protobuf::Descriptor*const&>
                              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                                *)&local_100,(void *)local_120._16_8_,(Descriptor **)&local_138);
                    puVar12 = local_f8;
                    pVVar22 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        ((RepeatedPtrFieldBase *)local_e8._40_8_,(int)lVar38);
                    iVar33 = *(int *)(puVar12 + 8);
                    if (iVar33 < 0) {
                      iVar33 = -1;
                    }
                    uVar31 = iVar33 + 1;
                    if (0x1ffffffe < uVar31) {
                      uVar31 = 0x1fffffff;
                    }
                    *(uint *)(puVar12 + 8) = uVar31;
                    if (*(long *)(puVar12 + 0x10) == 0) {
                      *(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
                        **)(puVar12 + 0x10) = pVVar22;
                      *(undefined4 *)(puVar12 + 0x18) = 1;
                    }
                    pcVar4 = *(char **)(*(long *)(local_120._0_8_ + 8) + 0x20);
                    sVar5 = *(size_t *)(*(long *)(local_120._0_8_ + 8) + 0x28);
                    pVVar22 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                        ((RepeatedPtrFieldBase *)local_e8._40_8_,(int)lVar38);
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_120;
                    pcStack_78 = absl::lts_20240722::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                    ;
                    make_error_02.invoker_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                    ;
                    make_error_02.ptr_.obj = &local_100;
                    element_name_03._M_str = pcVar4;
                    element_name_03._M_len = sVar5;
                    local_80.obj = &local_100;
                    AddError(local_130,element_name_03,&pVVar22->super_Message,NUMBER,make_error_02)
                    ;
                    SVar28.ptr_ = local_138.ptr_;
                  }
                  lVar38 = lVar38 + 1;
                } while (lVar38 < *(int *)(SVar28.ptr_ + 0x90));
              }
              this_02 = local_130;
              iVar41 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                       ::find<std::__cxx11::string>
                                 ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                   *)local_e8,
                                  *(key_arg<std::__cxx11::basic_string<char>_> **)
                                   (local_120._0_8_ + 8));
              if (iVar41.ctrl_ != (ctrl_t *)0x0) {
                pcVar4 = *(char **)(*(long *)(local_120._0_8_ + 8) + 0x20);
                sVar5 = *(size_t *)(*(long *)(local_120._0_8_ + 8) + 0x28);
                pVVar17 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                    ((RepeatedPtrFieldBase *)local_e8._32_8_,(int)uVar11);
                local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120;
                pcStack_88 = absl::lts_20240722::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
                ;
                make_error_03.invoker_ =
                     absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
                ;
                make_error_03.ptr_.obj = &local_100;
                element_name_04._M_str = pcVar4;
                element_name_04._M_len = sVar5;
                local_90 = &local_100;
                AddError(this_02,element_name_04,&pVVar17->super_Message,NAME,make_error_03);
              }
              uVar40 = uVar11 + 1;
              uVar36 = (ulong)*(int *)(local_138.ptr_ + 4);
            } while ((long)uVar40 < (long)uVar36);
          }
          if (0 < *(int *)(local_138.ptr_ + 0x88)) {
            local_128 = (DescriptorProto *)&(local_128->field_0)._impl_.extension_range_;
            pDVar23 = (Descriptor *)0x28;
            local_120._16_4_ = 1;
            lVar38 = 0;
            SVar28.ptr_ = local_138.ptr_;
            do {
              local_120._0_8_ = *(long *)(SVar28.ptr_ + 0x58) + lVar38 * 0x28;
              iVar33 = (int)lVar38;
              if (0 < *(int *)(SVar28.ptr_ + 0x90)) {
                lVar37 = 0;
                lVar39 = 0;
                do {
                  lVar8 = *(long *)(SVar28.ptr_ + 0x68);
                  local_120._24_8_ = lVar8 + lVar37;
                  if ((*(int *)(lVar8 + lVar37) < *(int *)(local_120._0_8_ + 4)) &&
                     (*(int *)local_120._0_8_ < *(int *)(lVar8 + 4 + lVar37))) {
                    pcVar4 = *(char **)(*(long *)(SVar28.ptr_ + 8) + 0x20);
                    sVar5 = *(size_t *)(*(long *)(SVar28.ptr_ + 8) + 0x28);
                    pVVar21 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)local_128,iVar33);
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_120;
                    local_f8 = local_120 + 0x18;
                    pcStack_98 = absl::lts_20240722::functional_internal::
                                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                    ;
                    local_e8._72_8_ = &local_100;
                    make_error_04.invoker_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                    ;
                    make_error_04.ptr_.obj = (void *)local_e8._72_8_;
                    element_name_05._M_str = pcVar4;
                    element_name_05._M_len = sVar5;
                    AddError(local_130,element_name_05,&pVVar21->super_Message,NUMBER,make_error_04)
                    ;
                    SVar28.ptr_ = local_138.ptr_;
                  }
                  lVar39 = lVar39 + 1;
                  lVar37 = lVar37 + 8;
                } while (lVar39 < *(int *)(SVar28.ptr_ + 0x90));
              }
              lVar38 = lVar38 + 1;
              local_120._8_8_ = pDVar23;
              if (lVar38 < *(int *)(SVar28.ptr_ + 0x88)) {
                uVar36 = local_120._16_8_ & 0xffffffff;
                do {
                  lVar39 = *(long *)(SVar28.ptr_ + 0x58);
                  local_120._24_8_ = &pDVar23->super_SymbolBase + lVar39;
                  if ((*(int *)(&pDVar23->super_SymbolBase + lVar39) < *(int *)(local_120._0_8_ + 4)
                      ) && (*(int *)local_120._0_8_ <
                            *(int *)((long)&pDVar23->field_count_ + lVar39))) {
                    pcVar4 = *(char **)(*(long *)(SVar28.ptr_ + 8) + 0x20);
                    sVar5 = *(size_t *)(*(long *)(SVar28.ptr_ + 8) + 0x28);
                    pVVar21 = internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                        ((RepeatedPtrFieldBase *)local_128,iVar33);
                    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_120 + 0x18);
                    local_f8 = local_120;
                    local_e8._64_8_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                    ;
                    local_e8._56_8_ = &local_100;
                    make_error_05.invoker_ =
                         absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                    ;
                    make_error_05.ptr_.obj = (void *)local_e8._56_8_;
                    element_name_06._M_str = pcVar4;
                    element_name_06._M_len = sVar5;
                    AddError(local_130,element_name_06,&pVVar21->super_Message,NUMBER,make_error_05)
                    ;
                    SVar28.ptr_ = local_138.ptr_;
                  }
                  pDVar23 = (Descriptor *)&pDVar23->proto_features_;
                  uVar31 = (int)uVar36 + 1;
                  uVar36 = (ulong)uVar31;
                } while ((int)uVar31 < *(int *)(SVar28.ptr_ + 0x88));
              }
              pDVar23 = (Descriptor *)(local_120._8_8_ + 0x28);
              local_120._16_4_ = local_120._16_4_ + 1;
            } while (lVar38 < *(int *)(SVar28.ptr_ + 0x88));
          }
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_e8);
          this = local_130;
        }
        this->recursion_depth_ = this->recursion_depth_ + 1;
        return;
      }
      goto LAB_001f2533;
    }
  }
  BuildMessage((DescriptorBuilder *)local_e8);
LAB_001f2533:
  BuildMessage();
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
  *(int *)((long)local_130 + 0x168) = *(int *)((long)local_130 + 0x168) + 1;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}